

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal)

{
  Fts5Config *pFVar1;
  sqlite3_value **ppsVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  Fts5Config *pFVar6;
  sqlite3_stmt *psVar7;
  long lVar8;
  bool bVar9;
  sqlite3_stmt *pDel;
  sqlite3_stmt *pSeek;
  sqlite3_stmt *local_70;
  sqlite3_stmt *local_68;
  sqlite3_stmt *local_60;
  Fts5Storage *local_58;
  undefined4 local_50;
  int local_4c;
  sqlite3_value **local_48;
  Fts5Config *local_40;
  sqlite_int64 local_38;
  
  pFVar6 = p->pConfig;
  local_70 = (sqlite3_stmt *)0x0;
  iVar3 = fts5StorageLoadTotals(p,1);
  if (iVar3 != 0) goto LAB_001aaa25;
  pFVar1 = p->pConfig;
  local_68 = (sqlite3_stmt *)0x0;
  if (apVal == (sqlite3_value **)0x0) {
    iVar3 = fts5StorageGetStmt(p,2,&local_68,(char **)0x0);
    psVar7 = local_68;
    if (iVar3 != 0) goto LAB_001aaa25;
    sqlite3_bind_int64(local_68,1,iDel);
    iVar3 = sqlite3_step(psVar7);
    if (iVar3 != 100) {
      iVar3 = sqlite3_reset(psVar7);
      goto LAB_001aaa25;
    }
  }
  local_50 = 0xffffffff;
  local_58 = p;
  local_38 = iDel;
  iVar4 = sqlite3Fts5IndexBeginWrite(p->pIndex,1,iDel);
  bVar9 = iVar4 == 0;
  local_40 = pFVar6;
  if (bVar9) {
    if (pFVar1->nCol < 1) {
      bVar9 = true;
    }
    else {
      lVar8 = 0;
      local_60 = local_68;
      psVar7 = local_68;
      local_48 = apVal;
      do {
        ppsVar2 = local_48;
        iVar4 = 0;
        if (pFVar1->abUnindexed[lVar8] == '\0') {
          if (psVar7 == (sqlite3_stmt *)0x0) {
            puVar5 = (uchar *)sqlite3ValueText(local_48[lVar8],'\x01');
            iVar3 = sqlite3ValueBytes(ppsVar2[lVar8],'\x01');
          }
          else {
            iVar3 = (int)lVar8 + 1;
            puVar5 = sqlite3_column_text(psVar7,iVar3);
            iVar3 = sqlite3_column_bytes(psVar7,iVar3);
          }
          local_4c = 0;
          if (puVar5 == (uchar *)0x0) {
            iVar4 = 0;
          }
          else {
            iVar4 = (*pFVar1->pTokApi->xTokenize)
                              (pFVar1->pTok,&local_58,4,(char *)puVar5,iVar3,
                               fts5StorageInsertCallback);
          }
          p->aTotalSize[lVar8] = p->aTotalSize[lVar8] - (long)local_4c;
          psVar7 = local_60;
        }
        bVar9 = iVar4 == 0;
      } while ((bVar9) && (lVar8 = lVar8 + 1, lVar8 < pFVar1->nCol));
    }
  }
  p->nTotalRow = p->nTotalRow + -1;
  iVar3 = sqlite3_reset(local_68);
  pFVar6 = local_40;
  iDel = local_38;
  if (!bVar9) {
    iVar3 = iVar4;
  }
LAB_001aaa25:
  if (iVar3 == 0) {
    if (pFVar6->bColumnsize == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = fts5StorageGetStmt(p,7,&local_70,(char **)0x0);
      psVar7 = local_70;
      if (iVar3 == 0) {
        sqlite3_bind_int64(local_70,1,iDel);
        sqlite3_step(psVar7);
        iVar3 = sqlite3_reset(psVar7);
      }
    }
  }
  if (pFVar6->eContent == 0) {
    if (iVar3 == 0) {
      iVar3 = fts5StorageGetStmt(p,5,&local_70,(char **)0x0);
    }
    psVar7 = local_70;
    if (iVar3 == 0) {
      sqlite3_bind_int64(local_70,1,iDel);
      sqlite3_step(psVar7);
      iVar3 = sqlite3_reset(psVar7);
    }
  }
  return iVar3;
}

Assistant:

static int sqlite3Fts5StorageDelete(Fts5Storage *p, i64 iDel, sqlite3_value **apVal){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = fts5StorageDeleteFromIndex(p, iDel, apVal);
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}